

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_test.c
# Opt level: O0

void test_msg_header_uint64(void)

{
  nng_err nVar1;
  int iVar2;
  nng_err nVar3;
  char *pcVar4;
  size_t sVar5;
  void *__s1;
  char *pcVar6;
  nng_err result__13;
  nng_err result__12;
  nng_err result__11;
  nng_err result__10;
  nng_err result__9;
  nng_err result__8;
  nng_err result__7;
  nng_err result__6;
  nng_err result__5;
  nng_err result__4;
  nng_err result__3;
  nng_err result__2;
  nng_err result__1;
  nng_err result_;
  uint8_t data [24];
  uint64_t local_18;
  uint64_t v;
  nng_msg *msg;
  
  _result__1 = 0x100000000000000;
  data[0] = '\0';
  data[1] = '\0';
  data[2] = '\0';
  data[3] = '\0';
  data[4] = '\0';
  data[5] = '\0';
  data[6] = '\0';
  data[7] = '\x02';
  data[8] = '\0';
  data[9] = '\0';
  data[10] = '\0';
  data[0xb] = '\0';
  data[0xc] = '\0';
  data[0xd] = '\0';
  data[0xe] = '\0';
  data[0xf] = '\x03';
  nVar1 = nng_msg_alloc((nng_msg **)&v,0);
  pcVar4 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                         ,0x1c9,"%s: expected success, got %s (%d)","nng_msg_alloc(&msg, 0)",pcVar4,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_msg_header_append_u64((nng_msg *)v,2);
  pcVar4 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                         ,0x1cb,"%s: expected success, got %s (%d)",
                         "nng_msg_header_append_u64(msg, 2)",pcVar4,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_msg_header_insert_u64((nng_msg *)v,1);
  pcVar4 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                         ,0x1cc,"%s: expected success, got %s (%d)",
                         "nng_msg_header_insert_u64(msg, 1)",pcVar4,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_msg_header_append_u64((nng_msg *)v,3);
  pcVar4 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                         ,0x1cd,"%s: expected success, got %s (%d)",
                         "nng_msg_header_append_u64(msg, 3)",pcVar4,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_msg_header_insert_u64((nng_msg *)v,0);
  pcVar4 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                         ,0x1ce,"%s: expected success, got %s (%d)",
                         "nng_msg_header_insert_u64(msg, 0)",pcVar4,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_msg_header_trim_u64((nng_msg *)v,&local_18);
  pcVar4 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                         ,0x1cf,"%s: expected success, got %s (%d)",
                         "nng_msg_header_trim_u64(msg, &v)",pcVar4,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  iVar2 = acutest_check_((uint)(local_18 == 0),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                         ,0x1d0,"%s","v == 0");
  if (iVar2 == 0) {
    acutest_abort_();
  }
  sVar5 = nng_msg_header_len((nng_msg *)v);
  iVar2 = acutest_check_((uint)(sVar5 == 0x18),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                         ,0x1d1,"%s","nng_msg_header_len(msg) == sizeof(data)");
  if (iVar2 == 0) {
    acutest_abort_();
  }
  __s1 = nng_msg_header((nng_msg *)v);
  iVar2 = memcmp(__s1,&result__1,0x18);
  iVar2 = acutest_check_((uint)(iVar2 == 0),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                         ,0x1d2,"%s","memcmp(nng_msg_header(msg), data, sizeof(data)) == 0");
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_msg_header_trim_u64((nng_msg *)v,&local_18);
  pcVar4 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                         ,0x1d3,"%s: expected success, got %s (%d)",
                         "nng_msg_header_trim_u64(msg, &v)",pcVar4,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  iVar2 = acutest_check_((uint)(local_18 == 1),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                         ,0x1d4,"%s","v == 1");
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_msg_header_chop_u64((nng_msg *)v,&local_18);
  pcVar4 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                         ,0x1d5,"%s: expected success, got %s (%d)",
                         "nng_msg_header_chop_u64(msg, &v)",pcVar4,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  iVar2 = acutest_check_((uint)(local_18 == 3),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                         ,0x1d6,"%s","v == 3");
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_msg_header_trim_u64((nng_msg *)v,&local_18);
  pcVar4 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                         ,0x1d7,"%s: expected success, got %s (%d)",
                         "nng_msg_header_trim_u64(msg, &v)",pcVar4,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  iVar2 = acutest_check_((uint)(local_18 == 2),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                         ,0x1d8,"%s","v == 2");
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar3 = nng_msg_header_trim_u64((nng_msg *)v,&local_18);
  pcVar4 = nng_strerror(NNG_EINVAL);
  acutest_check_((uint)(nVar3 == NNG_EINVAL),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                 ,0x1d9,"%s fails with %s","nng_msg_header_trim_u64(msg, &v)",pcVar4,nVar1);
  pcVar4 = nng_strerror(NNG_EINVAL);
  pcVar6 = nng_strerror(nVar3);
  acutest_message_("%s: expected %s (%d), got %s (%d)","nng_msg_header_trim_u64(msg, &v)",pcVar4,3,
                   pcVar6,(ulong)nVar3);
  nVar1 = nng_msg_header_chop_u64((nng_msg *)v,&local_18);
  pcVar4 = nng_strerror(NNG_EINVAL);
  acutest_check_((uint)(nVar1 == NNG_EINVAL),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                 ,0x1da,"%s fails with %s","nng_msg_header_chop_u64(msg, &v)",pcVar4);
  pcVar4 = nng_strerror(NNG_EINVAL);
  pcVar6 = nng_strerror(nVar1);
  acutest_message_("%s: expected %s (%d), got %s (%d)","nng_msg_header_chop_u64(msg, &v)",pcVar4,3,
                   pcVar6,(ulong)nVar1);
  nng_msg_clear((nng_msg *)v);
  nVar1 = nng_msg_append((nng_msg *)v,&local_18,1);
  pcVar4 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                         ,0x1dd,"%s: expected success, got %s (%d)","nng_msg_append(msg, &v, 1)",
                         pcVar4,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar3 = nng_msg_trim_u64((nng_msg *)v,&local_18);
  pcVar4 = nng_strerror(NNG_EINVAL);
  acutest_check_((uint)(nVar3 == NNG_EINVAL),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                 ,0x1de,"%s fails with %s","nng_msg_trim_u64(msg, &v)",pcVar4,nVar1);
  pcVar4 = nng_strerror(NNG_EINVAL);
  pcVar6 = nng_strerror(nVar3);
  acutest_message_("%s: expected %s (%d), got %s (%d)","nng_msg_trim_u64(msg, &v)",pcVar4,3,pcVar6,
                   (ulong)nVar3);
  nVar1 = nng_msg_chop_u64((nng_msg *)v,&local_18);
  pcVar4 = nng_strerror(NNG_EINVAL);
  acutest_check_((uint)(nVar1 == NNG_EINVAL),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                 ,0x1df,"%s fails with %s","nng_msg_chop_u64(msg, &v)",pcVar4);
  pcVar4 = nng_strerror(NNG_EINVAL);
  pcVar6 = nng_strerror(nVar1);
  acutest_message_("%s: expected %s (%d), got %s (%d)","nng_msg_chop_u64(msg, &v)",pcVar4,3,pcVar6,
                   (ulong)nVar1);
  nng_msg_free((nng_msg *)v);
  return;
}

Assistant:

void
test_msg_header_uint64(void)
{
	nng_msg *msg;
	uint64_t v;
	uint8_t  data[] = { 0, 0, 0, 0, 0, 0, 0, 1, 0, 0, 0, 0, 0, 0, 0, 2, 0,
		 0, 0, 0, 0, 0, 0, 3 };

	NUTS_PASS(nng_msg_alloc(&msg, 0));

	NUTS_PASS(nng_msg_header_append_u64(msg, 2));
	NUTS_PASS(nng_msg_header_insert_u64(msg, 1));
	NUTS_PASS(nng_msg_header_append_u64(msg, 3));
	NUTS_PASS(nng_msg_header_insert_u64(msg, 0));
	NUTS_PASS(nng_msg_header_trim_u64(msg, &v));
	NUTS_ASSERT(v == 0);
	NUTS_ASSERT(nng_msg_header_len(msg) == sizeof(data));
	NUTS_ASSERT(memcmp(nng_msg_header(msg), data, sizeof(data)) == 0);
	NUTS_PASS(nng_msg_header_trim_u64(msg, &v));
	NUTS_ASSERT(v == 1);
	NUTS_PASS(nng_msg_header_chop_u64(msg, &v));
	NUTS_ASSERT(v == 3);
	NUTS_PASS(nng_msg_header_trim_u64(msg, &v));
	NUTS_ASSERT(v == 2);
	NUTS_FAIL(nng_msg_header_trim_u64(msg, &v), NNG_EINVAL);
	NUTS_FAIL(nng_msg_header_chop_u64(msg, &v), NNG_EINVAL);

	nng_msg_clear(msg);
	NUTS_PASS(nng_msg_append(msg, &v, 1));
	NUTS_FAIL(nng_msg_trim_u64(msg, &v), NNG_EINVAL);
	NUTS_FAIL(nng_msg_chop_u64(msg, &v), NNG_EINVAL);

	nng_msg_free(msg);
}